

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unesctrn.cpp
# Opt level: O1

void __thiscall
icu_63::UnescapeTransliterator::handleTransliterate
          (UnescapeTransliterator *this,Replaceable *text,UTransPosition *pos,UBool isIncremental)

{
  ulong uVar1;
  UChar UVar2;
  UChar UVar3;
  UChar UVar4;
  UChar UVar5;
  UChar *pUVar6;
  bool bVar7;
  UChar UVar8;
  int iVar9;
  uint ch;
  int32_t iVar10;
  int iVar11;
  undefined4 uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  UChar32 ch_00;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  bool bVar20;
  UnicodeString str;
  int local_b8;
  UnicodeString local_70;
  
  uVar17 = pos->start;
  local_b8 = pos->limit;
  if ((int)uVar17 < local_b8) {
    do {
      iVar14 = 0;
      do {
        pUVar6 = this->spec;
        UVar2 = pUVar6[iVar14];
        if (UVar2 == L'\xffff') goto LAB_00289d98;
        UVar3 = pUVar6[(long)iVar14 + 1];
        UVar8 = pUVar6[(long)iVar14 + 2];
        UVar4 = pUVar6[(long)iVar14 + 3];
        iVar15 = iVar14 + 5;
        UVar5 = pUVar6[(long)iVar14 + 4];
        iVar14 = iVar15;
        if (UVar2 == L'\0') {
          bVar20 = false;
          uVar19 = (ulong)uVar17;
        }
        else {
          bVar20 = true;
          uVar16 = 0;
          do {
            uVar19 = uVar17 + uVar16;
            if (uVar16 != 0 && local_b8 <= (int)uVar19) {
              iVar9 = 10;
              if (isIncremental != '\0') goto LAB_00289c4c;
              bVar20 = true;
              goto LAB_00289ba4;
            }
            iVar9 = (*(text->super_UObject)._vptr_UObject[9])(text,uVar19 & 0xffffffff);
            uVar19 = uVar16 + 1;
            if ((UChar)iVar9 != this->spec[(long)iVar15 + uVar16]) {
              bVar20 = false;
              break;
            }
            uVar16 = uVar19;
          } while (uVar19 < (ushort)UVar2);
          bVar20 = !bVar20;
          uVar19 = (ulong)(uVar17 + (int)uVar19);
        }
LAB_00289ba4:
        if (bVar20) {
LAB_00289c45:
          iVar9 = 0;
          iVar14 = iVar15 + (uint)(ushort)UVar2 + (uint)(ushort)UVar3;
        }
        else {
          ch_00 = 0;
          uVar13 = 0;
          do {
            iVar9 = (int)uVar19;
            if (local_b8 <= iVar9) {
              if ((isIncremental != '\0') && ((int)uVar17 < iVar9)) {
                bVar20 = false;
                iVar9 = 10;
                goto LAB_00289c37;
              }
              break;
            }
            ch = (*(text->super_UObject)._vptr_UObject[10])(text,uVar19 & 0xffffffff);
            iVar10 = u_digit_63(ch,(char)UVar8);
            if (iVar10 < 0) {
              bVar20 = false;
            }
            else {
              uVar19 = (ulong)((iVar9 - (uint)(ch < 0x10000)) + 2);
              ch_00 = ch_00 * (char)UVar8 + iVar10;
              uVar13 = uVar13 + 1;
              bVar20 = uVar13 != (ushort)UVar5;
            }
          } while (bVar20);
          iVar9 = 0;
          bVar20 = true;
          if ((int)(uint)(ushort)UVar4 <= (int)uVar13) {
            if ((ushort)UVar3 == 0) {
              bVar7 = false;
            }
            else {
              iVar18 = (int)uVar19;
              iVar9 = iVar18;
              if (iVar18 < local_b8) {
                iVar9 = local_b8;
              }
              bVar7 = true;
              uVar16 = 0;
              do {
                if ((uint)(iVar9 - iVar18) == uVar16) {
                  uVar19 = (uVar19 & 0xffffffff) + uVar16;
                  if ((isIncremental != '\0') && ((int)uVar17 < (int)uVar19)) {
                    bVar20 = false;
                    iVar9 = 10;
                    goto LAB_00289c37;
                  }
                  bVar7 = true;
                  goto LAB_00289d33;
                }
                iVar11 = (*(text->super_UObject)._vptr_UObject[9])
                                   (text,(uVar19 & 0xffffffff) + uVar16);
                uVar1 = uVar16 + 1;
                if ((UChar)iVar11 != this->spec[(long)(int)(iVar15 + (uint)(ushort)UVar2) + uVar16])
                {
                  bVar7 = false;
                  break;
                }
                uVar16 = uVar1;
              } while (uVar1 < (uint)(ushort)UVar3);
              bVar7 = !bVar7;
              uVar19 = (ulong)(uint)(iVar18 + (int)uVar1);
            }
LAB_00289d33:
            iVar9 = 0;
            bVar20 = true;
            if (!bVar7) {
              icu_63::UnicodeString::UnicodeString(&local_70,ch_00);
              (*(text->super_UObject)._vptr_UObject[4])
                        (text,(ulong)uVar17,uVar19 & 0xffffffff,&local_70);
              uVar12 = local_70.fUnion.fFields.fLength;
              if (-1 < local_70.fUnion.fStackFields.fLengthAndFlags) {
                uVar12 = (int)local_70.fUnion.fStackFields.fLengthAndFlags >> 5;
              }
              local_b8 = ((local_b8 + uVar17) - (int)uVar19) + uVar12;
              icu_63::UnicodeString::~UnicodeString(&local_70);
              iVar9 = 4;
              bVar20 = false;
            }
          }
LAB_00289c37:
          if (bVar20) goto LAB_00289c45;
        }
LAB_00289c4c:
      } while (iVar9 == 0);
      if (iVar9 == 10) break;
LAB_00289d98:
      if ((int)uVar17 < local_b8) {
        uVar13 = (*(text->super_UObject)._vptr_UObject[10])(text,(ulong)uVar17);
        uVar17 = (uVar17 - (uVar13 < 0x10000)) + 2;
      }
    } while ((int)uVar17 < local_b8);
  }
  pos->contextLimit = pos->contextLimit + (local_b8 - pos->limit);
  pos->limit = local_b8;
  pos->start = uVar17;
  return;
}

Assistant:

void UnescapeTransliterator::handleTransliterate(Replaceable& text, UTransPosition& pos,
                                                 UBool isIncremental) const {
    int32_t start = pos.start;
    int32_t limit = pos.limit;
    int32_t i, j, ipat;

    while (start < limit) {
        // Loop over the forms in spec[].  Exit this loop when we
        // match one of the specs.  Exit the outer loop if a
        // partial match is detected and isIncremental is true.
        for (j=0, ipat=0; spec[ipat] != END; ++j) {

            // Read the header
            int32_t prefixLen = spec[ipat++];
            int32_t suffixLen = spec[ipat++];
            int8_t  radix     = (int8_t) spec[ipat++];
            int32_t minDigits = spec[ipat++];
            int32_t maxDigits = spec[ipat++];

            // s is a copy of start that is advanced over the
            // characters as we parse them.
            int32_t s = start;
            UBool match = TRUE;

            for (i=0; i<prefixLen; ++i) {
                if (s >= limit) {
                    if (i > 0) {
                        // We've already matched a character.  This is
                        // a partial match, so we return if in
                        // incremental mode.  In non-incremental mode,
                        // go to the next spec.
                        if (isIncremental) {
                            goto exit;
                        }
                        match = FALSE;
                        break;
                    }
                }
                UChar c = text.charAt(s++);
                if (c != spec[ipat + i]) {
                    match = FALSE;
                    break;
                }
            }

            if (match) {
                UChar32 u = 0;
                int32_t digitCount = 0;
                for (;;) {
                    if (s >= limit) {
                        // Check for partial match in incremental mode.
                        if (s > start && isIncremental) {
                            goto exit;
                        }
                        break;
                    }
                    UChar32 ch = text.char32At(s);
                    int32_t digit = u_digit(ch, radix);
                    if (digit < 0) {
                        break;
                    }
                    s += U16_LENGTH(ch);
                    u = (u * radix) + digit;
                    if (++digitCount == maxDigits) {
                        break;
                    }
                }

                match = (digitCount >= minDigits);

                if (match) {
                    for (i=0; i<suffixLen; ++i) {
                        if (s >= limit) {
                            // Check for partial match in incremental mode.
                            if (s > start && isIncremental) {
                                goto exit;
                            }
                            match = FALSE;
                            break;
                        }
                        UChar c = text.charAt(s++);
                        if (c != spec[ipat + prefixLen + i]) {
                            match = FALSE;
                            break;
                        }
                    }

                    if (match) {
                        // At this point, we have a match
                        UnicodeString str(u);
                        text.handleReplaceBetween(start, s, str);
                        limit -= s - start - str.length();
                        // The following break statement leaves the
                        // loop that is traversing the forms in
                        // spec[].  We then parse the next input
                        // character.
                        break;
                    }
                }
            }

            ipat += prefixLen + suffixLen;
        }

        if (start < limit) {
            start += U16_LENGTH(text.char32At(start));
        }
    }

  exit:
    pos.contextLimit += limit - pos.limit;
    pos.limit = limit;
    pos.start = start;
}